

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::Scrollbar(ImGuiAxis axis)

{
  ImGuiWindow *window;
  ImGuiID id;
  float *pfVar1;
  float *pfVar2;
  size_t idx;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  ImRect IVar7;
  ImRect inner_rect;
  float local_78;
  float fStack_74;
  ImVec2 local_68;
  ImVec2 IStack_60;
  ImVec2 local_58;
  ImRect local_40;
  
  window = GImGui->CurrentWindow;
  id = GetWindowScrollbarID(window,axis);
  KeepAliveID(id);
  IVar7 = ImGuiWindow::Rect(window);
  local_58 = IVar7.Min;
  local_68 = (window->InnerRect).Min;
  IStack_60 = (window->InnerRect).Max;
  fVar5 = window->WindowBorderSize;
  pfVar1 = ImVec2::operator[](&window->ScrollbarSizes,(long)(axis ^ ImGuiAxis_Y));
  fVar6 = *pfVar1;
  if (0.0 < fVar6) {
    idx = (size_t)axis;
    pfVar1 = ImVec2::operator[](&window->ScrollbarSizes,idx);
    uVar3 = (uint)(*pfVar1 <= 0.0) << 3;
    fStack_74 = IVar7.Max.y;
    if (axis == ImGuiAxis_X) {
      fVar6 = (fStack_74 - fVar5) - fVar6;
      uVar4 = -(uint)(fVar6 <= local_58.y);
      local_40.Min.y = (float)(uVar4 & (uint)local_58.y | ~uVar4 & (uint)fVar6);
      local_40.Max.y = fStack_74;
      uVar3 = uVar3 | 4;
      local_78 = IStack_60.x;
      local_40.Min.x = local_68.x;
    }
    else {
      local_78 = IVar7.Max.x;
      fVar6 = (local_78 - fVar5) - fVar6;
      uVar4 = -(uint)(fVar6 <= local_58.x);
      local_40.Max.y = (window->InnerRect).Max.y;
      uVar3 = uVar3 | (uint)~window->Flags >> 9 & -(window->Flags & 1U) & 2;
      local_40.Min.x = (float)(uVar4 & (uint)local_58.x | ~uVar4 & (uint)fVar6);
      local_40.Min.y = local_68.y;
    }
    local_40.Max.x = local_78;
    pfVar1 = ImVec2::operator[](&window->Scroll,idx);
    fVar5 = ImVec2::operator[](&IStack_60,idx);
    fVar6 = ImVec2::operator[](&local_68,idx);
    pfVar2 = ImVec2::operator[](&window->ContentSize,idx);
    local_58.x = *pfVar2;
    pfVar2 = ImVec2::operator[](&window->WindowPadding,idx);
    ScrollbarEx(&local_40,id,axis,pfVar1,fVar5 - fVar6,*pfVar2 + *pfVar2 + local_58.x,uVar3);
    return;
  }
  __assert_fail("scrollbar_size > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui_widgets.cpp"
                ,0x39d,"void ImGui::Scrollbar(ImGuiAxis)");
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1];
    IM_ASSERT(scrollbar_size > 0.0f);
    const float other_scrollbar_size = window->ScrollbarSizes[axis];
    ImDrawCornerFlags rounding_corners = (other_scrollbar_size <= 0.0f) ? ImDrawCornerFlags_BotRight : 0;
    ImRect bb;
    if (axis == ImGuiAxis_X)
    {
        bb.Min = ImVec2(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size));
        bb.Max = ImVec2(inner_rect.Max.x, outer_rect.Max.y);
        rounding_corners |= ImDrawCornerFlags_BotLeft;
    }
    else
    {
        bb.Min = ImVec2(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y);
        bb.Max = ImVec2(outer_rect.Max.x, window->InnerRect.Max.y);
        rounding_corners |= ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0;
    }
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], inner_rect.Max[axis] - inner_rect.Min[axis], window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f, rounding_corners);
}